

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ut.hpp
# Opt level: O0

bool __thiscall
boost::ext::ut::v1_1_8::runner<ApprovalTests::cfg::reporter,_16>::on<bool>
          (runner<ApprovalTests::cfg::reporter,_16> *this,assertion<bool> assertion)

{
  assertion_pass<bool> location;
  assertion_fail<bool> fail;
  long in_RDI;
  byte in_stack_00000008;
  undefined8 in_stack_00000010;
  undefined4 in_stack_00000018;
  undefined1 in_stack_ffffffffffffffc0;
  undefined7 in_stack_ffffffffffffffc1;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  undefined1 in_stack_ffffffffffffffd8;
  undefined7 in_stack_ffffffffffffffd9;
  undefined8 in_stack_ffffffffffffffe0;
  undefined1 local_1;
  
  if ((*(byte *)(in_RDI + 0x3a0) & 1) == 0) {
    if ((in_stack_00000008 & 1) == 0) {
      *(long *)(in_RDI + 0x268) = *(long *)(in_RDI + 0x268) + 1;
      fail._4_4_ = in_stack_ffffffffffffffd4;
      fail._0_4_ = in_stack_00000018;
      fail.location.file_._0_1_ = in_stack_ffffffffffffffd8;
      fail.location.file_._1_7_ = in_stack_ffffffffffffffd9;
      fail.location._8_8_ = in_stack_ffffffffffffffe0;
      ApprovalTests::cfg::reporter::on<bool>
                ((reporter *)
                 (CONCAT71(in_stack_ffffffffffffffc1,in_stack_00000008) & 0xffffffffffffff01),fail);
      local_1 = false;
    }
    else {
      location._4_4_ = in_stack_ffffffffffffffd4;
      location._0_4_ = in_stack_ffffffffffffffd0;
      location.location.file_._0_1_ = in_stack_00000008 & 1;
      location.location.file_._1_7_ = in_stack_ffffffffffffffd9;
      location.location._8_8_ = in_stack_00000010;
      ApprovalTests::cfg::reporter::on<bool>
                ((reporter *)CONCAT71(in_stack_ffffffffffffffc1,in_stack_ffffffffffffffc0),location)
      ;
      local_1 = true;
    }
  }
  else {
    local_1 = true;
  }
  return local_1;
}

Assistant:

[[nodiscard]] auto on(events::assertion<TExpr> assertion) -> bool {
      if (dry_run_) {
        return true;
      }

      if (static_cast<bool>(assertion.expr)) {
        reporter_.on(events::assertion_pass<TExpr>{
            .expr = assertion.expr, .location = assertion.location});
        return true;
      } else {
        ++fails_;
        reporter_.on(events::assertion_fail<TExpr>{
            .expr = assertion.expr, .location = assertion.location});
        return false;
      }
    }